

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O3

void vkt::texture::util::wrapTexelGridCoordLinear
               (IVec3 *baseTexel,IVec3 *texelGridOffset,int coordBits,ImgDim dim)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  int compNdx;
  long lVar4;
  
  iVar3 = 1 << ((byte)coordBits & 0x1f);
  if (dim - IMG_DIM_1D < 4) {
    lVar2 = *(long *)(&DAT_00b2a440 + (ulong)(dim - IMG_DIM_1D) * 8);
    lVar4 = 0;
    do {
      piVar1 = texelGridOffset->m_data + lVar4;
      *piVar1 = *piVar1 - iVar3 / 2;
      if (*piVar1 < 0) {
        baseTexel->m_data[lVar4] = baseTexel->m_data[lVar4] + -1;
        texelGridOffset->m_data[lVar4] = texelGridOffset->m_data[lVar4] + iVar3;
      }
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
  }
  return;
}

Assistant:

void wrapTexelGridCoordLinear (IVec3&		baseTexel,
							   IVec3&		texelGridOffset,
							   const int	coordBits,
							   const ImgDim dim)
{
	const int subdivisions = 1 << coordBits;

	int numComp;

	switch (dim)
	{
		case IMG_DIM_1D:
			numComp = 1;
			break;

		case IMG_DIM_2D:
			numComp = 2;
			break;

		case IMG_DIM_CUBE:
			numComp = 2;
			break;

		case IMG_DIM_3D:
			numComp = 3;
			break;

		default:
			numComp = 0;
			break;
	}

	for (int compNdx = 0; compNdx < numComp; ++compNdx)
	{
		texelGridOffset[compNdx] -= subdivisions / (int) 2;

		if (texelGridOffset[compNdx] < 0)
		{
			baseTexel      [compNdx] -= 1;
			texelGridOffset[compNdx] += (deInt32) subdivisions;
		}
	}
}